

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImRect IVar5;
  
  switch(rect_type) {
  case 0:
    IVar5 = ImGuiWindow::Rect(window);
    break;
  case 1:
    IVar5 = window->OuterRectClipped;
    break;
  case 2:
    IVar5 = window->InnerRect;
    break;
  case 3:
    IVar5 = window->InnerClipRect;
    break;
  case 4:
    IVar5 = window->WorkRect;
    break;
  case 5:
    IVar4 = window->ContentSize;
    goto LAB_0013a9e4;
  case 6:
    IVar4 = window->ContentSizeIdeal;
LAB_0013a9e4:
    IVar1 = (window->InnerRect).Min;
    fVar2 = (IVar1.x - (window->Scroll).x) + (window->WindowPadding).x;
    fVar3 = (IVar1.y - (window->Scroll).y) + (window->WindowPadding).y;
    IVar5.Min.y = fVar3;
    IVar5.Min.x = fVar2;
    IVar5.Max.y = IVar4.y + fVar3;
    IVar5.Max.x = IVar4.x + fVar2;
    break;
  case 7:
    IVar5 = window->ContentRegionRect;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x3057,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  return IVar5;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }